

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O0

void __thiscall
swrenderer::FillColumnPalCommand::Execute(FillColumnPalCommand *this,DrawerThread *thread)

{
  int pitch_00;
  int iVar1;
  int iVar2;
  uchar *dest_00;
  uint8_t color;
  uchar *puStack_28;
  int pitch;
  uint8_t *dest;
  int count;
  DrawerThread *thread_local;
  FillColumnPalCommand *this_local;
  
  dest_00 = (this->super_PalColumnCommand)._dest;
  dest._4_4_ = DrawerThread::count_for_thread
                         (thread,(this->super_PalColumnCommand).super_DrawerCommand._dest_y,
                          *(int *)&(this->super_PalColumnCommand).super_DrawerCommand.field_0xc);
  if (0 < dest._4_4_) {
    pitch_00 = (this->super_PalColumnCommand)._pitch;
    puStack_28 = DrawerThread::dest_for_thread<unsigned_char>
                           (thread,(this->super_PalColumnCommand).super_DrawerCommand._dest_y,
                            pitch_00,dest_00);
    iVar1 = thread->num_cores;
    iVar2 = (this->super_PalColumnCommand)._color;
    do {
      *puStack_28 = (uchar)iVar2;
      puStack_28 = puStack_28 + iVar1 * pitch_00;
      dest._4_4_ = dest._4_4_ + -1;
    } while (dest._4_4_ != 0);
  }
  return;
}

Assistant:

void FillColumnPalCommand::Execute(DrawerThread *thread)
	{
		int count;
		uint8_t *dest;

		count = _count;
		dest = _dest;

		count = thread->count_for_thread(_dest_y, count);
		if (count <= 0)
			return;

		int pitch = _pitch;
		dest = thread->dest_for_thread(_dest_y, pitch, dest);
		pitch *= thread->num_cores;

		uint8_t color = _color;
		do
		{
			*dest = color;
			dest += pitch;
		} while (--count);
	}